

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

void watch_dig(monst *mtmp,xchar x,xchar y,boolean zap)

{
  char cVar1;
  uint uVar2;
  permonst *ppVar3;
  level *plVar4;
  boolean bVar5;
  monst *pmVar6;
  int y_00;
  undefined7 in_register_00000011;
  int x_00;
  undefined7 in_register_00000031;
  char *pcVar7;
  
  plVar4 = level;
  y_00 = (int)CONCAT71(in_register_00000011,y);
  x_00 = (int)CONCAT71(in_register_00000031,x);
  bVar5 = in_town(x_00,y_00);
  if (bVar5 == '\0') {
    return;
  }
  bVar5 = closed_door(level,x_00,y_00);
  if (bVar5 == '\0') {
    cVar1 = plVar4->locations[x_00][y_00].typ;
    if (cVar1 == '\0') {
      if (((level->flags).field_0xa & 0x10) == 0) {
        return;
      }
    }
    else if ((((cVar1 != '\x0f') && ('\f' < cVar1)) && (cVar1 != '\r')) && (cVar1 != '\x1c')) {
      return;
    }
  }
  if (mtmp == (monst *)0x0) {
    pmVar6 = level->monlist;
    if (pmVar6 == (monst *)0x0) {
      return;
    }
    while ((((pmVar6->mhp < 1 ||
             (ppVar3 = pmVar6->data, ppVar3 != mons + 0x126 && ppVar3 != mons + 0x125)) ||
            ((uVar2 = *(uint *)&pmVar6->field_0x60, (uVar2 >> 0x11 & 1) == 0 ||
             ((u.uprops[0xd].blocked == 0 &&
               ((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
               (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
              ((ppVar3->mflags1 & 0x1000000) == 0)))))) ||
           (((uVar2 >> 9 & 1) != 0 ||
            ((((u._1052_1_ & 0x22) != 0 || ((uVar2 >> 0x16 & 1) == 0)) ||
             ((viz_array[pmVar6->my][pmVar6->mx] & 1U) == 0))))))) {
      pmVar6 = pmVar6->nmon;
      if (pmVar6 == (monst *)0x0) {
        return;
      }
    }
  }
  if (zap != '\0' || digging.warned != '\0') {
    verbalize("Halt, vandal!  You\'re under arrest!");
    angry_guards(flags.soundok == '\0');
    goto LAB_00166272;
  }
  cVar1 = plVar4->locations[x_00][y_00].typ;
  if (cVar1 == '\r') {
LAB_00166242:
    pcVar7 = "tree";
  }
  else if (cVar1 == '\x17') {
    pcVar7 = "door";
  }
  else {
    if ((cVar1 == '\0') && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0))
    goto LAB_00166242;
    pcVar7 = "fountain";
    if (cVar1 < '\x11') {
      pcVar7 = "wall";
    }
  }
  verbalize("Hey, stop damaging that %s!",pcVar7);
  digging.warned = '\x01';
LAB_00166272:
  if (occupation != dig) {
    return;
  }
  stop_occupation();
  return;
}

Assistant:

void watch_dig(struct monst *mtmp, xchar x, xchar y, boolean zap)
{
	struct rm *loc = &level->locations[x][y];

	if (in_town(x, y) &&
	    (closed_door(level, x, y) || loc->typ == SDOOR ||
	     IS_WALL(loc->typ) || IS_FOUNTAIN(loc->typ) ||
	     IS_TREE(level, loc->typ))) {
	    if (!mtmp) {
		for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		    if (DEADMONSTER(mtmp)) continue;
		    if ((mtmp->data == &mons[PM_WATCHMAN] ||
			 mtmp->data == &mons[PM_WATCH_CAPTAIN]) &&
			mtmp->mcansee && m_canseeu(mtmp) &&
			couldsee(mtmp->mx, mtmp->my) && mtmp->mpeaceful)
			break;
		}
	    }

	    if (mtmp) {
		if (zap || digging.warned) {
		    verbalize("Halt, vandal!  You're under arrest!");
		    angry_guards(!(flags.soundok));
		} else {
		    const char *str;

		    if (IS_DOOR(loc->typ))
			str = "door";
		    else if (IS_TREE(level, loc->typ))
			str = "tree";
		    else if (IS_ROCK(loc->typ))
			str = "wall";
		    else
			str = "fountain";
		    verbalize("Hey, stop damaging that %s!", str);
		    digging.warned = TRUE;
		}
		if (is_digging())
		    stop_occupation();
	    }
	}
}